

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O2

EStatusCode __thiscall
Type1ToType2Converter::CallOtherSubr
          (Type1ToType2Converter *this,LongList *inOperandList,LongList *outPostScriptOperandStack)

{
  ulong uVar1;
  _List_node_base *p_Var2;
  Trace *pTVar3;
  _List_node_base *p_Var4;
  LongList *this_00;
  long i;
  long lVar5;
  long flexDepth;
  
  uVar1 = (inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
  if (uVar1 < 3) {
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "Type1ToType2Converter::CallOtherSubr, expecting at least 3 arguments for 0 callothersubr (0, arguments count, flex depth...and some other args), but operand stack has only %d arguments. aborting"
                      ,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                       _M_node._M_size);
  }
  else {
    p_Var4 = ((inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
              super__List_node_base._M_prev)->_M_prev;
    p_Var2 = p_Var4[1]._M_next;
    if (p_Var2 <= (_List_node_base *)(uVar1 - 2)) {
      flexDepth = (long)p_Var4->_M_prev[1]._M_next;
      this_00 = &this->mFlexParameters;
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(this_00,&flexDepth);
      lVar5 = 0;
      for (; (lVar5 < (long)p_Var2 &&
             (p_Var4 != (inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                        _M_node.super__List_node_base._M_next)); p_Var4 = p_Var4->_M_prev) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  (outPostScriptOperandStack,(value_type_conflict6 *)(p_Var4->_M_prev + 1));
        lVar5 = lVar5 + 1;
      }
      RecordOperatorWithParameters(this,0xc23,this_00);
      std::__cxx11::list<long,_std::allocator<long>_>::clear(this_00);
      this->mInFlexCollectionMode = false;
      this->mIsFirst2Coordinates = false;
      return eSuccess;
    }
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "Type1ToType2Converter::CallOtherSubr, arguments count for other subr is %ld, but there\'s only %d arguments available on the stack. aborting"
                      ,p_Var2,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl
                              ._M_node._M_size - 2);
  }
  return eFailure;
}

Assistant:

EStatusCode Type1ToType2Converter::CallOtherSubr(const LongList& inOperandList,LongList& outPostScriptOperandStack)
{
	if(inOperandList.size() < 3) {
		TRACE_LOG1("Type1ToType2Converter::CallOtherSubr, expecting at least 3 arguments for 0 callothersubr (0, arguments count, flex depth...and some other args), but operand stack has only %d arguments. aborting", inOperandList.size());
		return eFailure;
	}

	// should get here onther for 0 othersubr, to mark flex segment end. implement it...and also insert a node
	// for flex
	LongList::const_reverse_iterator it = inOperandList.rbegin();
	++it;
	long argumentsCount = *it;
	if(inOperandList.size() - 2 < argumentsCount) {
		TRACE_LOG2("Type1ToType2Converter::CallOtherSubr, arguments count for other subr is %ld, but there's only %d arguments available on the stack. aborting", argumentsCount,inOperandList.size()-2);
		return eFailure;

	}
	++it;

	// the next argument should be the FD...place it in the parameters collection
	long flexDepth = *it;

	mFlexParameters.push_back(flexDepth);

	// take care of the postscript operand stack
	for(long i=0;i<argumentsCount && it != inOperandList.rend();++i)
	{
		outPostScriptOperandStack.push_back(*it);
		++it;
	}

	// now finalize flex, by placing a type 2 flex command
	EStatusCode status = RecordOperatorWithParameters(0x0c23,mFlexParameters);

	// cleanup flex mode
	mFlexParameters.clear();
	mInFlexCollectionMode = false;
    mIsFirst2Coordinates = false;
	return status;
}